

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O3

bool P_CreateCeiling(sector_t *sec,ECeiling type,line_t *line,int tag,double speed,double speed2,
                    double height,int crush,int silent,int change,ECrushMode hexencrush)

{
  vertex_t *pvVar1;
  bool bVar2;
  ECeiling EVar3;
  DCeiling *this;
  double *pdVar4;
  sector_t *psVar5;
  double *pdVar6;
  secspecial_t *spec;
  uint uVar7;
  double dVar8;
  double extraout_XMM0_Qb;
  double extraout_XMM0_Qb_00;
  double extraout_XMM0_Qb_01;
  double extraout_XMM0_Qb_02;
  double extraout_XMM0_Qb_03;
  double extraout_XMM0_Qb_04;
  double extraout_XMM0_Qb_05;
  double extraout_XMM0_Qb_06;
  double dVar9;
  double dVar10;
  double in_XMM2_Qb;
  double dVar11;
  double dVar12;
  vertex_t *spot;
  vertex_t *local_68;
  ECeiling *local_60;
  double local_58;
  double dStack_50;
  int local_44;
  sector_t *local_40;
  double local_38;
  
  local_60 = (ECeiling *)speed2;
  local_58 = height;
  dStack_50 = in_XMM2_Qb;
  local_38 = speed;
  bVar2 = sector_t::PlaneMoving(sec,1);
  if (bVar2) goto LAB_005176ac;
  local_44 = crush;
  this = (DCeiling *)
         M_Malloc_Dbg(0xa8,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                      ,0x1f7);
  DMovingCeiling::DMovingCeiling((DMovingCeiling *)this,sec,true);
  (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_00870d10;
  (this->m_NewSpecial).damagetype = (FName)0x0;
  (this->m_NewSpecial).damageamount = 0;
  (this->m_NewSpecial).special = 0;
  (this->m_NewSpecial).damageinterval = 0;
  (this->m_NewSpecial).leakydamage = 0;
  *(undefined2 *)&(this->m_NewSpecial).field_0xe = 0;
  (this->m_NewSpecial).Flags = 0;
  this->m_Crush = -1;
  this->m_CrushMode = crushDoom;
  this->m_Speed1 = local_38;
  this->m_Speed = local_38;
  this->m_Speed2 = (double)local_60;
  this->m_Silent = silent & 0xfffffffb;
  pvVar1 = (*sec->lines)->v1;
  dVar12 = dStack_50;
  local_68 = pvVar1;
  local_40 = sec;
  switch(type) {
  case ceilLowerByValue:
    dVar9 = (pvVar1->p).X * (sec->ceilingplane).normal.X;
    dVar8 = (pvVar1->p).Y * (sec->ceilingplane).normal.Y;
    dVar12 = 0.0;
    dVar11 = ((sec->ceilingplane).D + dVar9 + dVar8) * (sec->ceilingplane).negiC - local_58;
    this->m_BottomHeight = -((sec->ceilingplane).normal.Z * dVar11 + dVar8 + dVar9);
    goto LAB_005173ae;
  case ceilRaiseByValue:
    dVar9 = (pvVar1->p).X * (sec->ceilingplane).normal.X;
    dVar8 = (pvVar1->p).Y * (sec->ceilingplane).normal.Y;
    dVar11 = local_58 + ((sec->ceilingplane).D + dVar9 + dVar8) * (sec->ceilingplane).negiC;
    dVar9 = (sec->ceilingplane).normal.Z * dVar11 + dVar8 + dVar9;
    goto LAB_00517537;
  case ceilMoveToValue:
    dVar8 = (pvVar1->p).X * (sec->ceilingplane).normal.X;
    dVar10 = (pvVar1->p).Y * (sec->ceilingplane).normal.Y;
    dVar9 = -((sec->ceilingplane).normal.Z * local_58 + dVar10 + dVar8);
    dVar11 = local_58;
    if (local_58 < ((sec->ceilingplane).D + dVar8 + dVar10) * (sec->ceilingplane).negiC) {
      this->m_BottomHeight = dVar9;
      goto LAB_005173ae;
    }
    this->m_TopHeight = dVar9;
    goto LAB_00517545;
  case ceilLowerToHighestFloor:
    dVar11 = sector_t::FindHighestFloorSurrounding(sec,&local_68);
    goto LAB_00516fc8;
  case ceilLowerInstant:
    dVar9 = (pvVar1->p).X * (sec->ceilingplane).normal.X;
    dVar8 = (pvVar1->p).Y * (sec->ceilingplane).normal.Y;
    dVar12 = 0.0;
    dVar11 = ((sec->ceilingplane).D + dVar9 + dVar8) * (sec->ceilingplane).negiC - local_58;
    this->m_BottomHeight = -((sec->ceilingplane).normal.Z * dVar11 + dVar8 + dVar9);
    this->m_Direction = -1;
    this->m_Speed = local_58;
    goto LAB_005173b9;
  case ceilRaiseInstant:
    dVar12 = (pvVar1->p).X * (sec->ceilingplane).normal.X;
    dVar9 = (pvVar1->p).Y * (sec->ceilingplane).normal.Y;
    dVar11 = ((sec->ceilingplane).D + dVar12 + dVar9) * (sec->ceilingplane).negiC + local_58;
    this->m_TopHeight = -((sec->ceilingplane).normal.Z * dVar11 + dVar9 + dVar12);
    this->m_Direction = 1;
    this->m_Speed = local_58;
    dVar12 = 0.0;
    goto LAB_00517550;
  case ceilCrushAndRaise:
  case ceilCrushRaiseAndStay:
    this->m_TopHeight = (sec->ceilingplane).D;
  case ceilLowerAndCrush:
  case ceilLowerToFloor:
    dVar11 = sector_t::FindHighestFloorPoint(sec,&local_68);
LAB_00516fc8:
    dVar11 = local_58 + dVar11;
    dVar12 = (sec->ceilingplane).normal.X * (local_68->p).X;
    dVar9 = (sec->ceilingplane).normal.Y * (local_68->p).Y;
LAB_00516ff4:
    dVar9 = dVar9 + dVar12;
    dVar8 = (sec->ceilingplane).normal.Z * dVar11;
    dVar12 = dStack_50;
    goto LAB_0051739c;
  default:
    this->m_Tag = tag;
    this->m_Type = type;
    this->m_Crush = local_44;
    this->m_CrushMode = hexencrush;
    dVar11 = 0.0;
    dVar12 = 0.0;
    if (-1 < this->m_Direction) goto LAB_0051757f;
    goto LAB_005173e8;
  case ceilRaiseToNearest:
    dVar11 = sector_t::FindNextHighestCeiling(sec,&local_68);
    dVar12 = extraout_XMM0_Qb_01;
    break;
  case ceilLowerToLowest:
    dVar11 = sector_t::FindLowestCeilingSurrounding(sec,&local_68);
    dVar12 = extraout_XMM0_Qb_03;
    goto LAB_00517365;
  case ceilRaiseToHighest:
    dVar11 = sector_t::FindHighestCeilingSurrounding(sec,&local_68);
    dVar12 = extraout_XMM0_Qb_02;
    break;
  case ceilLowerToHighest:
    dVar11 = sector_t::FindHighestCeilingSurrounding(sec,&local_68);
    dVar12 = extraout_XMM0_Qb_00;
    goto LAB_00517365;
  case ceilRaiseToLowest:
    dVar11 = sector_t::FindLowestCeilingSurrounding(sec,&local_68);
    dVar12 = extraout_XMM0_Qb_04;
    break;
  case ceilLowerToNearest:
    dVar11 = sector_t::FindNextLowestCeiling(sec,&local_68);
    dVar12 = extraout_XMM0_Qb_05;
LAB_00517365:
    dVar9 = (sec->ceilingplane).normal.Y * (local_68->p).Y +
            (sec->ceilingplane).normal.X * (local_68->p).X;
    dVar8 = dVar11 * (sec->ceilingplane).normal.Z;
LAB_0051739c:
    this->m_BottomHeight = -(dVar8 + dVar9);
LAB_005173ae:
    this->m_Direction = -1;
LAB_005173b9:
    this->m_Tag = tag;
    this->m_Type = type;
    this->m_Crush = local_44;
    this->m_CrushMode = hexencrush;
LAB_005173e8:
    pdVar6 = &(local_40->ceilingplane).D;
    pdVar4 = &this->m_BottomHeight;
    goto LAB_00517594;
  case ceilRaiseToHighestFloor:
    dVar11 = sector_t::FindHighestFloorSurrounding(sec,&local_68);
    dVar12 = extraout_XMM0_Qb_06;
    break;
  case ceilRaiseToFloor:
    dVar11 = sector_t::FindHighestFloorPoint(sec,&local_68);
    dVar11 = local_58 + dVar11;
    dVar9 = (sec->ceilingplane).normal.X * (local_68->p).X;
    dVar8 = (sec->ceilingplane).normal.Y * (local_68->p).Y;
    dVar12 = dStack_50;
    goto LAB_005174d6;
  case ceilRaiseByTexture:
    dStack_50 = (pvVar1->p).Y * (sec->ceilingplane).normal.Y;
    local_58 = (dStack_50 + (sec->ceilingplane).D + (pvVar1->p).X * (sec->ceilingplane).normal.X) *
               (sec->ceilingplane).negiC;
    dVar11 = sector_t::FindShortestUpperAround(sec);
    dVar11 = dVar11 + local_58;
    dVar9 = (sec->ceilingplane).normal.X * (pvVar1->p).X;
    dVar8 = (sec->ceilingplane).normal.Y * (pvVar1->p).Y;
    dVar12 = extraout_XMM0_Qb;
LAB_005174d6:
    dVar8 = dVar8 + dVar9;
    dVar9 = (sec->ceilingplane).normal.Z * dVar11;
    goto LAB_00517533;
  case ceilLowerByTexture:
    dStack_50 = (pvVar1->p).Y * (sec->ceilingplane).normal.Y;
    local_58 = (dStack_50 + (sec->ceilingplane).D + (pvVar1->p).X * (sec->ceilingplane).normal.X) *
               (sec->ceilingplane).negiC;
    dVar11 = sector_t::FindShortestUpperAround(sec);
    dVar11 = local_58 - dVar11;
    dVar12 = (sec->ceilingplane).normal.X * (pvVar1->p).X;
    dVar9 = (sec->ceilingplane).normal.Y * (pvVar1->p).Y;
    goto LAB_00516ff4;
  }
  dVar8 = (sec->ceilingplane).normal.Y * (local_68->p).Y +
          (sec->ceilingplane).normal.X * (local_68->p).X;
  dVar9 = dVar11 * (sec->ceilingplane).normal.Z;
LAB_00517533:
  dVar9 = dVar9 + dVar8;
LAB_00517537:
  this->m_TopHeight = -dVar9;
LAB_00517545:
  this->m_Direction = 1;
LAB_00517550:
  this->m_Tag = tag;
  this->m_Type = type;
  this->m_Crush = local_44;
  this->m_CrushMode = hexencrush;
LAB_0051757f:
  pdVar6 = &this->m_TopHeight;
  pdVar4 = &(local_40->ceilingplane).D;
LAB_00517594:
  local_60 = &this->m_Type;
  if ((*pdVar6 - *pdVar4 <= this->m_Speed) &&
     (local_58 = dVar11, dStack_50 = dVar12, DMover::StopInterpolation((DMover *)this,true),
     dVar11 = local_58, (silent & 4U) != 0)) {
    this->m_Silent = 2;
  }
  uVar7 = change & 3;
  if (uVar7 != 0) {
    spec = &this->m_NewSpecial;
    if ((change & 4U) == 0) {
      if (line != (line_t *)0x0) {
        psVar5 = line->frontsector;
        (this->m_Texture).texnum = psVar5->planes[1].Texture.texnum;
        if (uVar7 == 3) {
LAB_0051767a:
          EVar3 = genCeilingChg;
        }
        else {
          if (uVar7 != 2) goto LAB_00517681;
LAB_0051766b:
          sector_t::GetSpecial(psVar5,spec);
          EVar3 = genCeilingChgT;
        }
LAB_00517699:
        *local_60 = EVar3;
      }
    }
    else {
      if ((type == ceilRaiseToFloor) || (type == ceilLowerToFloor)) {
        psVar5 = sector_t::FindModelFloorSector(local_40,dVar11);
      }
      else {
        psVar5 = sector_t::FindModelCeilingSector(local_40,dVar11);
      }
      if (psVar5 != (sector_t *)0x0) {
        (this->m_Texture).texnum = psVar5->planes[1].Texture.texnum;
        if (uVar7 == 3) goto LAB_0051767a;
        psVar5 = local_40;
        if (uVar7 == 2) goto LAB_0051766b;
LAB_00517681:
        spec->damagetype = (FName)0x0;
        spec->damageamount = 0;
        (this->m_NewSpecial).special = 0;
        (this->m_NewSpecial).damageinterval = 0;
        (this->m_NewSpecial).leakydamage = 0;
        *(undefined2 *)&(this->m_NewSpecial).field_0xe = 0;
        (this->m_NewSpecial).Flags = 0;
        EVar3 = genCeilingChg0;
        goto LAB_00517699;
      }
    }
  }
  DCeiling::PlayCeilingSound(this);
LAB_005176ac:
  return !bVar2;
}

Assistant:

bool P_CreateCeiling(sector_t *sec, DCeiling::ECeiling type, line_t *line, int tag, 
				   double speed, double speed2, double height,
				   int crush, int silent, int change, DCeiling::ECrushMode hexencrush)
{
	double		targheight = 0;	// Silence, GCC

	// if ceiling already moving, don't start a second function on it
	if (sec->PlaneMoving(sector_t::ceiling))
	{
		return false;
	}
	
	// new door thinker
	DCeiling *ceiling = new DCeiling (sec, speed, speed2, silent & ~4);
	vertex_t *spot = sec->lines[0]->v1;

	switch (type)
	{
	case DCeiling::ceilCrushAndRaise:
	case DCeiling::ceilCrushRaiseAndStay:
		ceiling->m_TopHeight = sec->ceilingplane.fD();
	case DCeiling::ceilLowerAndCrush:
		targheight = sec->FindHighestFloorPoint (&spot);
		targheight += height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToHighest:
		targheight = sec->FindHighestCeilingSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerByValue:
		targheight = sec->ceilingplane.ZatPoint (spot) - height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseByValue:
		targheight = sec->ceilingplane.ZatPoint (spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilMoveToValue:
		{
			double diff = height - sec->ceilingplane.ZatPoint (spot);

			targheight = height;
			if (diff < 0)
			{
				ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, height);
				ceiling->m_Direction = -1;
			}
			else
			{
				ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, height);
				ceiling->m_Direction = 1;
			}
		}
		break;

	case DCeiling::ceilLowerToHighestFloor:
		targheight = sec->FindHighestFloorSurrounding (&spot) + height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToHighestFloor:
		targheight = sec->FindHighestFloorSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerInstant:
		targheight = sec->ceilingplane.ZatPoint (spot) - height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		ceiling->m_Speed = height;
		break;

	case DCeiling::ceilRaiseInstant:
		targheight = sec->ceilingplane.ZatPoint (spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		ceiling->m_Speed = height;
		break;

	case DCeiling::ceilLowerToNearest:
		targheight = sec->FindNextLowestCeiling (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToNearest:
		targheight = sec->FindNextHighestCeiling (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToLowest:
		targheight = sec->FindLowestCeilingSurrounding (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToLowest:
		targheight = sec->FindLowestCeilingSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToFloor:
		targheight = sec->FindHighestFloorPoint (&spot) + height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToFloor:	// [RH] What's this for?
		targheight = sec->FindHighestFloorPoint (&spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToHighest:
		targheight = sec->FindHighestCeilingSurrounding (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilLowerByTexture:
		targheight = sec->ceilingplane.ZatPoint (spot) - sec->FindShortestUpperAround ();
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseByTexture:
		targheight = sec->ceilingplane.ZatPoint (spot) + sec->FindShortestUpperAround ();
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	default:
		break;	// Silence GCC
	}
			
	ceiling->m_Tag = tag;
	ceiling->m_Type = type;
	ceiling->m_Crush = crush;
	ceiling->m_CrushMode = hexencrush;

	// Do not interpolate instant movement ceilings.
	// Note for ZDoomGL: Check to make sure that you update the sector
	// after the ceiling moves, because it hasn't actually moved yet.
	double movedist;

	if (ceiling->m_Direction < 0)
	{
		movedist = sec->ceilingplane.fD() - ceiling->m_BottomHeight;
	}
	else
	{
		movedist = ceiling->m_TopHeight - sec->ceilingplane.fD();
	}
	if (ceiling->m_Speed >= movedist)
	{
		ceiling->StopInterpolation(true);
		if (silent & 4) ceiling->m_Silent = 2;
	}

	// set texture/type change properties
	if (change & 3)		// if a texture change is indicated
	{
		if (change & 4)	// if a numeric model change
		{
			sector_t *modelsec;

			//jff 5/23/98 find model with floor at target height if target
			//is a floor type
			modelsec = (/*type == ceilRaiseToHighest ||*/
				   type == DCeiling::ceilRaiseToFloor ||
				   /*type == ceilLowerToHighest ||*/
				   type == DCeiling::ceilLowerToFloor) ?
				sec->FindModelFloorSector (targheight) :
				sec->FindModelCeilingSector (targheight);
			if (modelsec != NULL)
			{
				ceiling->m_Texture = modelsec->GetTexture(sector_t::ceiling);
				switch (change & 3)
				{
					case 1:		// type is zeroed
						ceiling->m_NewSpecial.Clear();
						ceiling->m_Type = DCeiling::genCeilingChg0;
						break;
					case 2:		// type is copied
						sec->GetSpecial(&ceiling->m_NewSpecial);
						ceiling->m_Type = DCeiling::genCeilingChgT;
						break;
					case 3:		// type is left alone
						ceiling->m_Type = DCeiling::genCeilingChg;
						break;
				}
			}
		}
		else if (line)	// else if a trigger model change
		{
			ceiling->m_Texture = line->frontsector->GetTexture(sector_t::ceiling);
			switch (change & 3)
			{
				case 1:		// type is zeroed
					ceiling->m_NewSpecial.Clear();
					ceiling->m_Type = DCeiling::genCeilingChg0;
					break;
				case 2:		// type is copied
					line->frontsector->GetSpecial(&ceiling->m_NewSpecial);
					ceiling->m_Type = DCeiling::genCeilingChgT;
					break;
				case 3:		// type is left alone
					ceiling->m_Type = DCeiling::genCeilingChg;
					break;
			}
		}
	}

	ceiling->PlayCeilingSound ();
	return ceiling != NULL;
}